

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *g;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  
  pIVar6 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if ((text_end == (char *)0x0) && (text_end = text, text != (char *)0xffffffffffffffff)) {
    do {
      if (*text_end == '#') {
        if (text_end[1] == '#') goto LAB_00124c6b;
      }
      else if (*text_end == '\0') goto LAB_00124c6b;
      text_end = text_end + 1;
    } while (text_end != (char *)0xffffffffffffffff);
    text_end = (char *)0xffffffffffffffff;
  }
LAB_00124c6b:
  fVar1 = ref_pos->y;
  fVar2 = (pIVar5->DC).LogLinePosY;
  (pIVar5->DC).LogLinePosY = fVar1;
  iVar3 = (pIVar5->DC).TreeDepth;
  if (iVar3 < pIVar6->LogStartDepth) {
    pIVar6->LogStartDepth = iVar3;
  }
  iVar4 = pIVar6->LogStartDepth;
  pcVar11 = text;
  do {
    if (pcVar11 < text_end) {
      lVar7 = (long)text_end - (long)pcVar11;
      pcVar9 = pcVar11;
      do {
        if (*pcVar9 == '\n') goto LAB_00124cda;
        pcVar9 = pcVar9 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    pcVar9 = (char *)0x0;
LAB_00124cda:
    pcVar10 = pcVar9;
    if (pcVar9 == (char *)0x0) {
      pcVar10 = text_end;
    }
    if ((pcVar10 != pcVar11 || pcVar9 != (char *)0x0) && pcVar10 != (char *)0x0) {
      uVar8 = (int)pcVar10 - (int)pcVar11;
      if ((fVar2 + 1.0 < fVar1) || (pcVar11 != text)) {
        ImGui::LogText("\n%*s%.*s",(ulong)(uint)((iVar3 - iVar4) * 4),"",(ulong)uVar8,pcVar11);
      }
      else {
        ImGui::LogText(" %.*s",(ulong)uVar8,pcVar11);
      }
    }
    pcVar11 = pcVar10 + 1;
    if (pcVar9 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void LogRenderedText(const ImVec2& ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = ImGui::GetCurrentWindowRead();

    if (!text_end)
        text_end = ImGui::FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos.y > window->DC.LogLinePosY+1;
    window->DC.LogLinePosY = ref_pos.y;

    const char* text_remaining = text;
    if (g.LogStartDepth > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogStartDepth = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogStartDepth);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        const char* line_end = text_remaining;
        while (line_end < text_end)
            if (*line_end == '\n')
                break;
            else
                line_end++;
        if (line_end >= text_end)
            line_end = NULL;

        const bool is_first_line = (text == text_remaining);
        bool is_last_line = false;
        if (line_end == NULL)
        {
            is_last_line = true;
            line_end = text_end;
        }
        if (line_end != NULL && !(is_last_line && (line_end - text_remaining)==0))
        {
            const int char_count = (int)(line_end - text_remaining);
            if (log_new_line || !is_first_line)
                ImGui::LogText(IM_NEWLINE "%*s%.*s", tree_depth*4, "", char_count, text_remaining);
            else
                ImGui::LogText(" %.*s", char_count, text_remaining);
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}